

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SectHdrsWrapper.h
# Opt level: O2

size_t __thiscall SectHdrsWrapper::getSecIndex(SectHdrsWrapper *this,SectionHdrWrapper *sec)

{
  pointer ppEVar1;
  size_t sVar2;
  const_iterator itr;
  pointer ppEVar3;
  
  sVar2 = SECT_INVALID_INDEX;
  if (sec != (SectionHdrWrapper *)0x0) {
    ppEVar3 = (this->super_PENodeWrapper).super_ExeNodeWrapper.entries.
              super__Vector_base<ExeNodeWrapper_*,_std::allocator<ExeNodeWrapper_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppEVar1 = (this->super_PENodeWrapper).super_ExeNodeWrapper.entries.
              super__Vector_base<ExeNodeWrapper_*,_std::allocator<ExeNodeWrapper_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppEVar1 != ppEVar3) {
      sVar2 = 0;
      for (; (ppEVar3 != ppEVar1 && ((SectionHdrWrapper *)*ppEVar3 != sec)); ppEVar3 = ppEVar3 + 1)
      {
        sVar2 = sVar2 + 1;
      }
    }
  }
  return sVar2;
}

Assistant:

size_t getSecIndex(SectionHdrWrapper* sec) const
    {
        if (!sec || !entries.size()) return SECT_INVALID_INDEX;
        size_t indx = 0;
        for (auto itr = entries.begin(); itr != entries.end(); ++itr, ++indx) {
            if (sec == *itr) {
                return indx;
            }
        }
        return indx;
    }